

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O0

void __thiscall PatchOptimizeMaps::PatchOptimizeMaps(PatchOptimizeMaps *this)

{
  PatchOptimizeMaps *this_local;
  
  GamePatch::GamePatch(&this->super_GamePatch);
  (this->super_GamePatch)._vptr_GamePatch = (_func_int **)&PTR_load_from_rom_003c8208;
  return;
}

Assistant:

void alter_world(World& world) override
    {
        clear_unreachable_maps(world);
        remove_useless_entities(world);
        optimize_palettes_usage(world);
        optimize_map_connections(world);

        transform_variant_into_standard(world.map(MAP_MERCATOR_CASTLE_THRONE_ROOM_ARTHUR_VARIANT));
        transform_variant_into_standard(world.map(MAP_RYUMA_INN_VARIANT));
        transform_variant_into_standard(world.map(MAP_MERCATOR_HOTEL_VARIANT));

        remove_useless_map_variants(world);
    }